

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

char * off_bit_name(long *off_flags)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  off_bit_name::buf[0] = '\0';
  uVar4 = *off_flags;
  if ((uVar4 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," area_at",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 5,"_attack",8);
    uVar4 = *off_flags;
  }
  if ((uVar4 & 2) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," backsta",8);
    (off_bit_name::buf + sVar3 + 8)[0] = 'b';
    (off_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar4 = *off_flags;
  }
  if ((uVar4 & 4) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," bas",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 'h';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar4 = *off_flags;
  }
  if ((uVar4 & 8) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," berserk",8);
    off_bit_name::buf[sVar3 + 8] = '\0';
    uVar4 = *off_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," disarm",8);
    uVar4 = *off_flags;
  }
  if ((uVar4 & 0x20) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," dod",4);
    builtin_strncpy(off_bit_name::buf + sVar3 + 3,"dge",4);
    uVar4 = *off_flags;
  }
  uVar2 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," fad",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 'e';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((char)uVar2 < '\0') {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," fas",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 't';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," kic",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 'k';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," kick_di",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 7,"irt",4);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," par",4);
    builtin_strncpy(off_bit_name::buf + sVar3 + 3,"rry",4);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," tai",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 'l';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," tri",4);
    (off_bit_name::buf + sVar3 + 4)[0] = 'p';
    (off_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," cru",4);
    builtin_strncpy(off_bit_name::buf + sVar3 + 3,"ush",4);
    uVar2 = (uint)*off_flags;
  }
  if ((short)uVar2 < 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 8,"all",4);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 6,"t_align",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 5,"st_race",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 8,"players",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 6,"t_guard",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x14 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 5,"st_vnum",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x15 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," no_trac",8);
    (off_bit_name::buf + sVar3 + 8)[0] = 'k';
    (off_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x16 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," static_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 6,"c_track",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," spam_mu",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 5,"_murder",8);
    uVar2 = (uint)*off_flags;
  }
  if ((uVar2 >> 0x1a & 1) != 0) {
    sVar3 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar3," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar3 + 6,"t_group",8);
  }
  pcVar1 = off_bit_name::buf;
  if (off_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *off_bit_name(long off_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(off_flags, OFF_AREA_ATTACK))
		strcat(buf, " area_attack");

	if (IS_SET(off_flags, OFF_BACKSTAB))
		strcat(buf, " backstab");

	if (IS_SET(off_flags, OFF_BASH))
		strcat(buf, " bash");

	if (IS_SET(off_flags, OFF_BERSERK))
		strcat(buf, " berserk");

	if (IS_SET(off_flags, OFF_DISARM))
		strcat(buf, " disarm");

	if (IS_SET(off_flags, OFF_DODGE))
		strcat(buf, " dodge");

	if (IS_SET(off_flags, OFF_FADE))
		strcat(buf, " fade");

	if (IS_SET(off_flags, OFF_FAST))
		strcat(buf, " fast");

	if (IS_SET(off_flags, OFF_KICK))
		strcat(buf, " kick");

	if (IS_SET(off_flags, OFF_KICK_DIRT))
		strcat(buf, " kick_dirt");

	if (IS_SET(off_flags, OFF_PARRY))
		strcat(buf, " parry");

	if (IS_SET(off_flags, OFF_TAIL))
		strcat(buf, " tail");

	if (IS_SET(off_flags, OFF_TRIP))
		strcat(buf, " trip");

	if (IS_SET(off_flags, OFF_CRUSH))
		strcat(buf, " crush");

	if (IS_SET(off_flags, ASSIST_ALL))
		strcat(buf, " assist_all");

	if (IS_SET(off_flags, ASSIST_ALIGN))
		strcat(buf, " assist_align");

	if (IS_SET(off_flags, ASSIST_RACE))
		strcat(buf, " assist_race");

	if (IS_SET(off_flags, ASSIST_PLAYERS))
		strcat(buf, " assist_players");

	if (IS_SET(off_flags, ASSIST_GUARD))
		strcat(buf, " assist_guard");

	if (IS_SET(off_flags, ASSIST_VNUM))
		strcat(buf, " assist_vnum");

	if (IS_SET(off_flags, NO_TRACK))
		strcat(buf, " no_track");

	if (IS_SET(off_flags, STATIC_TRACKING))
		strcat(buf, " static_track");

	if (IS_SET(off_flags, SPAM_MURDER))
		strcat(buf, " spam_murder");

	if (IS_SET(off_flags, ASSIST_GROUP))
		strcat(buf, " assist_group");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}